

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O2

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::HasExpressionArgs(Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                    *this,LinTerms *lt)

{
  ptr piVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  _Vector_base<int,_std::allocator<int>_> local_48;
  ptr local_30;
  size_ty local_28;
  
  piVar1 = (lt->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
  local_28 = (lt->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar5 = local_28 << 2;
  lVar2 = 0;
  local_30 = piVar1;
  do {
    lVar4 = lVar2;
    if (lVar5 == lVar4) break;
    bVar3 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                      ((FlatModel<mp::DefaultFlatModelParams> *)
                       &this[-8].MarkVarIfLogical_._M_invoker,*(int *)((long)piVar1 + lVar4));
    lVar2 = lVar4 + 4;
  } while (bVar3);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return lVar5 != lVar4;
}

Assistant:

bool HasExpressionArgs(const LinTerms& lt) const {
    for (auto v: lt.vars())
      if (!MPCD( IsProperVar(v) )) {
        return true;
      }
    return false;
  }